

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::FenceVkImpl::FenceVkImpl
          (FenceVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVkImpl,FenceDesc *Desc,bool IsDeviceInternal)

{
  SemaphoreWrapper SStack_38;
  
  FenceBase<Diligent::EngineVkImplTraits>::FenceBase
            (&this->super_FenceBase<Diligent::EngineVkImplTraits>,pRefCounters,pRenderDeviceVkImpl,
             Desc,IsDeviceInternal);
  (this->super_FenceBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>.
  super_ObjectBase<Diligent::IFenceVk>.super_RefCountedObject<Diligent::IFenceVk>.super_IFenceVk.
  super_IFence.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00a557d0;
  (this->m_TimelineSemaphore).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_TimelineSemaphore).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_TimelineSemaphore).m_VkObject = (VkSemaphore_T *)0x0;
  (this->m_SyncPointsGuard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_SyncPointsGuard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_SyncPointsGuard).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_SyncPointsGuard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_SyncPointsGuard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::
  _Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
  ::_Deque_base(&(this->m_SyncPoints).
                 super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
               );
  this->m_MaxSyncPoints = 0;
  if (((this->super_FenceBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
       .m_Desc.Type == FENCE_TYPE_GENERAL) &&
     ((pRenderDeviceVkImpl->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.NativeFence !=
      DEVICE_FEATURE_STATE_DISABLED)) {
    VulkanUtilities::VulkanLogicalDevice::CreateTimelineSemaphore
              (&SStack_38,
               (pRenderDeviceVkImpl->m_LogicalVkDevice).
               super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,0,(this->super_FenceBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                        .m_Desc.super_DeviceObjectAttribs.Name);
    VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>::
    operator=(&this->m_TimelineSemaphore,&SStack_38);
    VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>::
    ~VulkanObjectWrapper(&SStack_38);
  }
  return;
}

Assistant:

FenceVkImpl::FenceVkImpl(IReferenceCounters* pRefCounters,
                         RenderDeviceVkImpl* pRenderDeviceVkImpl,
                         const FenceDesc&    Desc,
                         bool                IsDeviceInternal) :
    // clang-format off
    TFenceBase
    {
        pRefCounters,
        pRenderDeviceVkImpl,
        Desc,
        IsDeviceInternal
    }
// clang-format on
{
    if (m_Desc.Type == FENCE_TYPE_GENERAL &&
        pRenderDeviceVkImpl->GetFeatures().NativeFence)
    {
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice{pRenderDeviceVkImpl->GetLogicalDevice()};
        m_TimelineSemaphore = LogicalDevice.CreateTimelineSemaphore(0, m_Desc.Name);
    }
}